

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O1

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_lift(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this)

{
  uint uVar1;
  Verbosity VVar2;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar3;
  VarStatus *pVVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  SVar8;
  bool bVar9;
  int iVar10;
  long lVar11;
  SPxLPRational *pSVar12;
  ulong uVar13;
  Verbosity old_verbosity;
  Item *vec;
  uint uVar14;
  long lVar15;
  long lVar16;
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
  *prVar17;
  int iVar20;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  SVectorRational liftingRowVector;
  Rational newValue;
  Rational minValue;
  DSVectorRational colVector;
  Rational maxValue;
  Element liftingRowMem [2];
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  local_558;
  undefined1 local_548 [16];
  undefined1 local_538 [16];
  data_type local_528;
  undefined1 local_518 [16];
  undefined1 local_508 [16];
  undefined1 local_4f8 [16];
  undefined1 local_4e8 [13];
  undefined3 uStack_4db;
  undefined5 uStack_4d8;
  undefined8 local_4d0;
  Rational *local_4c8;
  Rational *local_4c0;
  undefined1 local_4b8 [8];
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_4b0;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_4a0;
  data_type local_498;
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  undefined1 local_468 [16];
  undefined1 local_458 [16];
  undefined1 local_448 [16];
  undefined1 local_438 [13];
  undefined3 uStack_42b;
  undefined5 uStack_428;
  undefined8 local_420;
  undefined1 local_418 [8];
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_410;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_400;
  ulong local_3f8;
  void *local_3f0;
  undefined4 local_3e8;
  undefined2 local_3e4;
  char local_3e2;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  local_3d8;
  undefined1 local_3b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [13];
  undefined3 uStack_34b;
  undefined5 uStack_348;
  undefined8 local_340;
  undefined **local_238;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_220;
  undefined1 local_218 [16];
  undefined4 local_208;
  undefined2 local_204;
  char local_202;
  ulong local_1f8;
  void *local_1f0;
  undefined4 local_1e8;
  undefined2 local_1e4;
  char local_1e2;
  data_type local_1d8;
  char local_1c3;
  char local_1c2;
  uint local_1b8;
  void *local_1b0;
  char local_1a3;
  char local_1a2;
  undefined8 auStack_198 [2];
  undefined4 uStack_188;
  undefined2 uStack_184;
  undefined1 auStack_182 [10];
  undefined8 auStack_178 [2];
  undefined4 uStack_168;
  undefined2 uStack_164;
  undefined1 auStack_162 [10];
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  local_158 [2];
  data_type local_b8;
  char local_a3;
  char local_a2;
  uint local_98;
  void *local_90;
  char local_83;
  char local_82;
  data_type local_78;
  char local_63;
  char local_62;
  uint local_58;
  void *local_50;
  char local_43;
  char local_42;
  
  (*this->_statistics->transformTime->_vptr_Timer[3])();
  this->_beforeLiftCols =
       (this->_rationalLP->
       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
       ).
       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
       .set.thenum;
  this->_beforeLiftRows =
       (this->_rationalLP->
       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
       ).
       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
       .set.thenum;
  local_3d8.
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  .m_elem = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
             *)0x0;
  local_3d8.
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  .memsize = 0;
  local_3d8.
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  .memused = 0;
  local_3d8._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006a9f50;
  local_3d8.theelem =
       (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        *)0x0;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::allocMem(&local_3d8,8);
  lVar11 = 0x40;
  vec = (Item *)0x0;
  do {
    *(undefined8 *)((long)auStack_198 + lVar11) = 0;
    *(undefined4 *)((long)&uStack_188 + lVar11) = 1;
    *(undefined2 *)((long)&uStack_184 + lVar11) = 0x100;
    auStack_182[lVar11] = 0;
    *(undefined8 *)((long)auStack_178 + lVar11) = 1;
    *(undefined4 *)((long)&uStack_168 + lVar11) = 1;
    *(undefined2 *)((long)&uStack_164 + lVar11) = 0x100;
    auStack_162[lVar11] = 0;
    *(undefined4 *)
     ((long)&local_158[0].val.m_backend.m_value.num.m_backend.
             super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
             .m_data + lVar11) = 0;
    lVar11 = lVar11 + 0x50;
  } while (lVar11 != 0xe0);
  local_558.m_elem = local_158;
  local_558.memsize = 2;
  local_558.memused = 0;
  local_218._0_8_ =
       (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        *)0x0;
  local_208 = 1;
  local_204 = 0x100;
  local_202 = '\0';
  local_1f8 = 1;
  local_1e8 = 1;
  local_1e4 = 0x100;
  local_1e2 = '\0';
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
  ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
               *)local_218,(longdouble)this->_currentSettings->_realParamValues[0xe]);
  pSVar12 = this->_rationalLP;
  if (0 < (pSVar12->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          .set.thenum) {
    local_4c0 = &this->_rationalNegInfty;
    local_4c8 = &this->_rationalPosInfty;
    lVar11 = 0;
    do {
      vec = (pSVar12->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            .set.theitem +
            (pSVar12->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            .set.thekey[lVar11].idx;
      DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>>
      ::operator=((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>>
                   *)&local_3d8,
                  (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                   *)vec);
      lVar15 = (long)local_3d8.
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                     .memused;
      if (0 < lVar15) {
        lVar16 = lVar15 + 1;
        iVar20 = -1;
        bVar9 = false;
        lVar15 = lVar15 * 0x50;
        do {
          prVar17 = (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                     *)((long)&local_3d8.
                               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                               .m_elem[-1].val.m_backend.m_value.num.m_backend.
                               super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                               .m_data + lVar15);
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_78.ld,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)prVar17);
          local_548._8_8_ = &local_78;
          local_548._0_8_ = &local_498;
          boost::multiprecision::
          number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
          ::
          number<boost::multiprecision::detail::function,boost::multiprecision::detail::abs_funct<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,void,void>
                    ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                      *)local_3b8,
                     (expression<boost::multiprecision::detail::function,_boost::multiprecision::detail::abs_funct<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>_>,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                      *)local_548,(type *)0x0);
          vec = (Item *)local_218;
          iVar10 = boost::multiprecision::backends::
                   rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                   ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)local_3b8,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)local_218);
          if ((local_388[5] == '\0') && (local_388[6] == '\0')) {
            vec = (Item *)((ulong)(uint)local_398._0_4_ << 3);
            operator_delete((void *)local_398._8_8_,(ulong)vec);
          }
          if ((local_3a8._M_local_buf[5] == '\0') && (local_3a8._M_local_buf[6] == '\0')) {
            vec = (Item *)((ulong)(uint)local_3b8._0_4_ << 3);
            operator_delete((void *)local_3b8._8_8_,(ulong)vec);
          }
          if ((local_43 == '\0') && (local_42 == '\0')) {
            vec = (Item *)((ulong)local_58 << 3);
            operator_delete(local_50,(ulong)vec);
          }
          if ((local_63 == '\0') && (local_62 == '\0')) {
            vec = (Item *)((ulong)local_78.ld.capacity << 3);
            operator_delete(local_78.ld.data,(ulong)vec);
          }
          if (0 < iVar10) {
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
            ::str_abi_cxx11_((string *)local_3b8,prVar17,0,
                             ~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3b8._0_8_ != &local_3a8) {
              operator_delete((void *)local_3b8._0_8_,local_3a8._M_allocated_capacity + 1);
            }
            if (!bVar9) {
              iVar20 = (this->_rationalLP->
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                       ).
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                       .set.thenum;
              SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              ::add(&local_558,(int)lVar11,
                    (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                     *)local_218);
              local_548._0_8_ = (type)0xffffffffffffffff;
              boost::multiprecision::backends::
              rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              ::rational_adaptor<long_long>
                        ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                          *)local_3b8,(longlong *)local_548,(type *)0x0);
              SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              ::add(&local_558,iVar20,
                    (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                     *)local_3b8);
              if ((local_388[5] == '\0') && (local_388[6] == '\0')) {
                operator_delete((void *)local_398._8_8_,(ulong)(uint)local_398._0_4_ << 3);
              }
              if ((local_3a8._M_local_buf[5] == '\0') && (local_3a8._M_local_buf[6] == '\0')) {
                operator_delete((void *)local_3b8._8_8_,(ulong)(uint)local_3b8._0_4_ << 3);
              }
              pSVar12 = this->_rationalLP;
              auVar5._8_8_ = 0;
              auVar5._0_8_ = local_498.la[1];
              local_498.double_first = (double_limb_type)(auVar5 << 0x40);
              boost::multiprecision::backends::
              rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              ::rational_adaptor<long_long>
                        ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                          *)local_548,(longlong *)local_498.la,(type *)0x0);
              local_1d8.la[0] = 0;
              boost::multiprecision::backends::
              rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              ::rational_adaptor<long_long>
                        ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                          *)&local_498.ld,(longlong *)local_1d8.la,(type *)0x0);
              local_418 = (undefined1  [8])0x0;
              boost::multiprecision::backends::
              rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              ::rational_adaptor<long_long>
                        ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                          *)&local_1d8.ld,(longlong *)local_418,(type *)0x0);
              LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              ::LPRowBase((LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                           *)local_3b8,
                          (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                           *)local_548,&local_558,
                          (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                           *)&local_498.ld,
                          (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                           *)&local_1d8.ld);
              (*(pSVar12->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                .
                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                ._vptr_ClassArray[5])
                        (pSVar12,(LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)local_3b8,0);
              LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              ::~LPRowBase((LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                            *)local_3b8);
              if ((local_1a3 == '\0') && (local_1a2 == '\0')) {
                operator_delete(local_1b0,(ulong)local_1b8 << 3);
              }
              if ((local_1c3 == '\0') && (local_1c2 == '\0')) {
                operator_delete(local_1d8.ld.data,(local_1d8.la[0] & 0xffffffff) << 3);
              }
              if ((local_468[5] == '\0') && (local_468[6] == '\0')) {
                operator_delete((void *)local_478._8_8_,(ulong)(uint)local_478._0_4_ << 3);
              }
              if ((local_488[5] == '\0') && (local_488[6] == '\0')) {
                operator_delete(local_498.ld.data,(ulong)local_498.ld.capacity << 3);
              }
              if ((local_518[5] == false) && (local_518[6] == false)) {
                operator_delete(local_528.ld.data,(ulong)local_528.ld.capacity << 3);
              }
              if ((local_538[5] == false) && (local_538[6] == false)) {
                operator_delete((void *)local_548._8_8_,(ulong)(uint)local_548._0_4_ << 3);
              }
              pSVar3 = this->_realLP;
              local_4d0._0_4_ = cpp_dec_float_finite;
              local_4d0._4_4_ = 0x1c;
              local_548._0_8_ = (type)0x0;
              local_548._8_8_ = (type)0x0;
              local_538 = (undefined1  [16])0x0;
              local_528.double_first = 0;
              local_518 = (undefined1  [16])0x0;
              local_508 = (undefined1  [16])0x0;
              local_4f8 = (undefined1  [16])0x0;
              local_4e8 = SUB1613((undefined1  [16])0x0,0);
              uStack_4db = 0;
              uStack_4d8._0_4_ = 0;
              uStack_4d8._4_1_ = false;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)local_548,0.0);
              local_410.m_elem =
                   (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)0x0;
              local_410.memsize = 0;
              local_410.memused = 0;
              local_418 = (undefined1  [8])&PTR__DSVectorBase_006b38e0;
              local_400 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x0;
              DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::allocMem((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)local_418,local_558.memused);
              SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              ::operator=((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                           *)&local_410,&local_558);
              local_420 = 0x1c00000000;
              local_498.double_first = 0;
              local_488 = (undefined1  [16])0x0;
              local_478 = (undefined1  [16])0x0;
              local_468 = (undefined1  [16])0x0;
              local_458 = (undefined1  [16])0x0;
              local_448 = (undefined1  [16])0x0;
              local_438 = SUB1613((undefined1  [16])0x0,0);
              uStack_42b = 0;
              uStack_428 = 0;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)&local_498.ld,0.0);
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>
                        ((cpp_dec_float<200U,_int,_void> *)&local_1d8.ld,0,(type *)0x0);
              LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::LPRowBase((LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)local_3b8,
                          (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)local_548,&local_410,
                          (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_498.ld,
                          (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_1d8.ld);
              (*(pSVar3->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._vptr_ClassArray[5])
                        (pSVar3,(LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)local_3b8,0);
              local_238 = &PTR__DSVectorBase_006b38e0;
              if (local_220 !=
                  (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x0) {
                free(local_220);
                local_220 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)0x0;
              }
              local_418 = (undefined1  [8])&PTR__DSVectorBase_006b38e0;
              if (local_400 !=
                  (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x0) {
                free(local_400);
                local_400 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)0x0;
              }
              (*(this->_rationalLP->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                .
                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                ._vptr_ClassArray[0x30])(this->_rationalLP,iVar20,local_4c0,local_4c8,0);
              pSVar3 = this->_realLP;
              local_340._0_4_ = cpp_dec_float_finite;
              local_340._4_4_ = 0x1c;
              local_3b8 = (undefined1  [16])0x0;
              local_3a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           )0x0;
              local_398 = (undefined1  [16])0x0;
              local_388 = (undefined1  [16])0x0;
              local_378 = (undefined1  [16])0x0;
              local_368 = (undefined1  [16])0x0;
              local_358 = SUB1613((undefined1  [16])0x0,0);
              uStack_34b = 0;
              uStack_348._0_4_ = 0;
              uStack_348._4_1_ = false;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)local_3b8,
                         (double)((ulong)this->_currentSettings->_realParamValues[6] ^
                                 (ulong)DAT_00601010));
              local_4d0._0_4_ = cpp_dec_float_finite;
              local_4d0._4_4_ = 0x1c;
              local_548._0_8_ = (type)0x0;
              local_548._8_8_ = (type)0x0;
              local_538 = (undefined1  [16])0x0;
              local_528.double_first = 0;
              local_518 = (undefined1  [16])0x0;
              local_508 = (undefined1  [16])0x0;
              local_4f8 = (undefined1  [16])0x0;
              local_4e8 = SUB1613((undefined1  [16])0x0,0);
              uStack_4db = 0;
              uStack_4d8._0_4_ = 0;
              uStack_4d8._4_1_ = false;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)local_548,
                         this->_currentSettings->_realParamValues[6]);
              (*(pSVar3->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._vptr_ClassArray[0x30])
                        (pSVar3,iVar20,local_3b8,(cpp_dec_float<200u,int,void> *)local_548,0);
              local_558._8_8_ = local_558._8_8_ & 0xffffffff;
              bVar9 = true;
            }
            uVar14 = *(uint *)((long)&local_3d8.
                                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                      .m_elem[-1].idx + lVar15);
            pSVar12 = this->_rationalLP;
            auVar25._8_8_ = 0;
            auVar25._0_8_ = local_548._8_8_;
            local_548 = auVar25 << 0x40;
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
            ::rational_adaptor<long_long>
                      ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)local_3b8,(longlong *)local_548,(type *)0x0);
            (*(pSVar12->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
              ._vptr_ClassArray[0x43])
                      (pSVar12,(ulong)uVar14,lVar11,(cpp_dec_float<200U,_int,_void> *)local_3b8,0);
            if ((local_388[5] == '\0') && (local_388[6] == '\0')) {
              operator_delete((void *)local_398._8_8_,(ulong)(uint)local_398._0_4_ << 3);
            }
            if ((local_3a8._M_local_buf[5] == '\0') && (local_3a8._M_local_buf[6] == '\0')) {
              operator_delete((void *)local_3b8._8_8_,(ulong)(uint)local_3b8._0_4_ << 3);
            }
            pSVar3 = this->_realLP;
            local_340._0_4_ = cpp_dec_float_finite;
            local_340._4_4_ = 0x1c;
            local_3b8 = (undefined1  [16])0x0;
            local_3a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         )0x0;
            local_398 = (undefined1  [16])0x0;
            local_388 = (undefined1  [16])0x0;
            local_378 = (undefined1  [16])0x0;
            local_368 = (undefined1  [16])0x0;
            local_358 = SUB1613((undefined1  [16])0x0,0);
            uStack_34b = 0;
            uStack_348._0_4_ = 0;
            uStack_348._4_1_ = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)local_3b8,0.0);
            (*(pSVar3->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x43])
                      (pSVar3,(ulong)uVar14,lVar11,(cpp_dec_float<200U,_int,_void> *)local_3b8);
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
            ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                *)local_548,
                               (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                *)prVar17);
            local_3b8._0_8_ = (Item *)local_218;
            boost::multiprecision::
            number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
            ::
            do_divide<boost::multiprecision::detail::expression<boost::multiprecision::detail::terminal,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,void,void,void>>
                      ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                        *)local_548,
                       (expression<boost::multiprecision::detail::terminal,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void,_void>
                        *)local_3b8,(terminal *)&local_498.ld);
            (*(this->_rationalLP->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
              ._vptr_ClassArray[0x43])
                      (this->_rationalLP,(ulong)uVar14,iVar20,
                       (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                        *)local_548);
            pSVar3 = this->_realLP;
            local_340._0_4_ = cpp_dec_float_finite;
            local_340._4_4_ = 0x1c;
            local_3b8 = (undefined1  [16])0x0;
            local_3a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         )0x0;
            local_398 = (undefined1  [16])0x0;
            local_388 = (undefined1  [16])0x0;
            local_378 = (undefined1  [16])0x0;
            local_368 = (undefined1  [16])0x0;
            local_358 = SUB1613((undefined1  [16])0x0,0);
            uStack_34b = 0;
            uStack_348._0_4_ = 0;
            uStack_348._4_1_ = false;
            boost::multiprecision::detail::
            generic_convert_rational_to_float<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>
                      ((cpp_dec_float<200U,_int,_void> *)local_3b8,
                       (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)local_548);
            vec = (Item *)(ulong)uVar14;
            (*(pSVar3->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x43])(pSVar3,vec,iVar20);
            if ((local_518[5] == false) && (local_518[6] == false)) {
              vec = (Item *)((ulong)local_528.ld.capacity << 3);
              operator_delete(local_528.ld.data,(ulong)vec);
            }
            if ((local_538[5] == false) && (local_538[6] == false)) {
              vec = (Item *)((ulong)(uint)local_548._0_4_ << 3);
              operator_delete((void *)local_548._8_8_,(ulong)vec);
            }
          }
          lVar16 = lVar16 + -1;
          lVar15 = lVar15 + -0x50;
        } while (1 < lVar16);
      }
      lVar11 = lVar11 + 1;
      pSVar12 = this->_rationalLP;
    } while (lVar11 < (pSVar12->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      ).
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      .set.thenum);
  }
  SVar8 = local_410;
  local_418 = (undefined1  [8])0x0;
  local_410.memsize = 1;
  local_410.memused._0_2_ = 0x100;
  local_410.memused._3_1_ = SVar8.memused._3_1_;
  local_410.memused._2_1_ = 0;
  local_3f8 = 1;
  local_3e8 = 1;
  local_3e4 = 0x100;
  local_3e2 = '\0';
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
  ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
               *)local_418,(longdouble)this->_currentSettings->_realParamValues[0xd]);
  pSVar12 = this->_rationalLP;
  iVar20 = (pSVar12->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
           .set.thenum;
  if (0 < iVar20) {
    local_4c0 = &this->_rationalNegInfty;
    local_4c8 = &this->_rationalPosInfty;
    lVar11 = 0;
    do {
      vec = (pSVar12->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            .set.theitem +
            (pSVar12->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            .set.thekey[lVar11].idx;
      DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>>
      ::operator=((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>>
                   *)&local_3d8,
                  (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                   *)vec);
      lVar15 = (long)local_3d8.
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                     .memused;
      if (0 < lVar15) {
        lVar16 = lVar15 + 1;
        iVar20 = -1;
        bVar9 = false;
        lVar15 = lVar15 * 0x50;
        do {
          prVar17 = (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                     *)((long)&local_3d8.
                               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                               .m_elem[-1].val.m_backend.m_value.num.m_backend.
                               super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                               .m_data + lVar15);
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_b8.ld,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)prVar17);
          local_548._8_8_ = &local_b8;
          local_548._0_8_ = &local_498;
          boost::multiprecision::
          number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
          ::
          number<boost::multiprecision::detail::function,boost::multiprecision::detail::abs_funct<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,void,void>
                    ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                      *)local_3b8,
                     (expression<boost::multiprecision::detail::function,_boost::multiprecision::detail::abs_funct<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>_>,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                      *)local_548,(type *)0x0);
          vec = (Item *)local_418;
          iVar10 = boost::multiprecision::backends::
                   rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                   ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)local_3b8,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)local_418);
          if ((local_388[5] == '\0') && (local_388[6] == '\0')) {
            vec = (Item *)((ulong)(uint)local_398._0_4_ << 3);
            operator_delete((void *)local_398._8_8_,(ulong)vec);
          }
          if ((local_3a8._M_local_buf[5] == '\0') && (local_3a8._M_local_buf[6] == '\0')) {
            vec = (Item *)((ulong)(uint)local_3b8._0_4_ << 3);
            operator_delete((void *)local_3b8._8_8_,(ulong)vec);
          }
          if ((local_83 == '\0') && (local_82 == '\0')) {
            vec = (Item *)((ulong)local_98 << 3);
            operator_delete(local_90,(ulong)vec);
          }
          if ((local_a3 == '\0') && (local_a2 == '\0')) {
            vec = (Item *)((ulong)local_b8.ld.capacity << 3);
            operator_delete(local_b8.ld.data,(ulong)vec);
          }
          if (iVar10 < 0) {
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
            ::str_abi_cxx11_((string *)local_3b8,prVar17,0,
                             ~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3b8._0_8_ != &local_3a8) {
              operator_delete((void *)local_3b8._0_8_,local_3a8._M_allocated_capacity + 1);
            }
            if (!bVar9) {
              iVar20 = (this->_rationalLP->
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                       ).
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                       .set.thenum;
              SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              ::add(&local_558,(int)lVar11,
                    (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                     *)local_418);
              local_548._0_8_ = (type)0xffffffffffffffff;
              boost::multiprecision::backends::
              rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              ::rational_adaptor<long_long>
                        ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                          *)local_3b8,(longlong *)local_548,(type *)0x0);
              SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              ::add(&local_558,iVar20,
                    (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                     *)local_3b8);
              if ((local_388[5] == '\0') && (local_388[6] == '\0')) {
                operator_delete((void *)local_398._8_8_,(ulong)(uint)local_398._0_4_ << 3);
              }
              if ((local_3a8._M_local_buf[5] == '\0') && (local_3a8._M_local_buf[6] == '\0')) {
                operator_delete((void *)local_3b8._8_8_,(ulong)(uint)local_3b8._0_4_ << 3);
              }
              pSVar12 = this->_rationalLP;
              auVar6._8_8_ = 0;
              auVar6._0_8_ = local_498.la[1];
              local_498.double_first = (double_limb_type)(auVar6 << 0x40);
              boost::multiprecision::backends::
              rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              ::rational_adaptor<long_long>
                        ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                          *)local_548,(longlong *)local_498.la,(type *)0x0);
              local_1d8.la[0] = 0;
              boost::multiprecision::backends::
              rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              ::rational_adaptor<long_long>
                        ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                          *)&local_498.ld,(longlong *)local_1d8.la,(type *)0x0);
              local_4b8 = (undefined1  [8])0x0;
              boost::multiprecision::backends::
              rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              ::rational_adaptor<long_long>
                        ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                          *)&local_1d8.ld,(longlong *)local_4b8,(type *)0x0);
              LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              ::LPRowBase((LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                           *)local_3b8,
                          (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                           *)local_548,&local_558,
                          (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                           *)&local_498.ld,
                          (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                           *)&local_1d8.ld);
              (*(pSVar12->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                .
                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                ._vptr_ClassArray[5])
                        (pSVar12,(LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)local_3b8,0);
              LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              ::~LPRowBase((LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                            *)local_3b8);
              if ((local_1a3 == '\0') && (local_1a2 == '\0')) {
                operator_delete(local_1b0,(ulong)local_1b8 << 3);
              }
              if ((local_1c3 == '\0') && (local_1c2 == '\0')) {
                operator_delete(local_1d8.ld.data,(local_1d8.la[0] & 0xffffffff) << 3);
              }
              if ((local_468[5] == '\0') && (local_468[6] == '\0')) {
                operator_delete((void *)local_478._8_8_,(ulong)(uint)local_478._0_4_ << 3);
              }
              if ((local_488[5] == '\0') && (local_488[6] == '\0')) {
                operator_delete(local_498.ld.data,(ulong)local_498.ld.capacity << 3);
              }
              if ((local_518[5] == false) && (local_518[6] == false)) {
                operator_delete(local_528.ld.data,(ulong)local_528.ld.capacity << 3);
              }
              if ((local_538[5] == false) && (local_538[6] == false)) {
                operator_delete((void *)local_548._8_8_,(ulong)(uint)local_548._0_4_ << 3);
              }
              pSVar3 = this->_realLP;
              local_4d0._0_4_ = cpp_dec_float_finite;
              local_4d0._4_4_ = 0x1c;
              local_548._0_8_ = (type)0x0;
              local_548._8_8_ = (type)0x0;
              local_538 = (undefined1  [16])0x0;
              local_528.double_first = 0;
              local_518 = (undefined1  [16])0x0;
              local_508 = (undefined1  [16])0x0;
              local_4f8 = (undefined1  [16])0x0;
              local_4e8 = SUB1613((undefined1  [16])0x0,0);
              uStack_4db = 0;
              uStack_4d8._0_4_ = 0;
              uStack_4d8._4_1_ = false;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)local_548,0.0);
              local_4b0.m_elem =
                   (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)0x0;
              local_4b0.memsize = 0;
              local_4b0.memused = 0;
              local_4b8 = (undefined1  [8])&PTR__DSVectorBase_006b38e0;
              local_4a0 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x0;
              DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::allocMem((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)local_4b8,local_558.memused);
              SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              ::operator=((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                           *)&((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)local_4b8)->
                              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ,&local_558);
              local_420 = 0x1c00000000;
              local_498.double_first = 0;
              local_488 = (undefined1  [16])0x0;
              local_478 = (undefined1  [16])0x0;
              local_468 = (undefined1  [16])0x0;
              local_458 = (undefined1  [16])0x0;
              local_448 = (undefined1  [16])0x0;
              local_438 = SUB1613((undefined1  [16])0x0,0);
              uStack_42b = 0;
              uStack_428 = 0;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)&local_498.ld,0.0);
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>
                        ((cpp_dec_float<200U,_int,_void> *)&local_1d8.ld,0,(type *)0x0);
              LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::LPRowBase((LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)local_3b8,
                          (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)local_548,
                          &((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)local_4b8)->
                           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_498.ld,
                          (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_1d8.ld);
              (*(pSVar3->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._vptr_ClassArray[5])
                        (pSVar3,(LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)local_3b8,0);
              local_238 = &PTR__DSVectorBase_006b38e0;
              if (local_220 !=
                  (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x0) {
                free(local_220);
                local_220 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)0x0;
              }
              local_4b8 = (undefined1  [8])&PTR__DSVectorBase_006b38e0;
              if (local_4a0 !=
                  (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x0) {
                free(local_4a0);
                local_4a0 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)0x0;
              }
              (*(this->_rationalLP->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                .
                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                ._vptr_ClassArray[0x30])(this->_rationalLP,iVar20,local_4c0,local_4c8,0);
              pSVar3 = this->_realLP;
              local_340._0_4_ = cpp_dec_float_finite;
              local_340._4_4_ = 0x1c;
              local_3b8 = (undefined1  [16])0x0;
              local_3a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           )0x0;
              local_398 = (undefined1  [16])0x0;
              local_388 = (undefined1  [16])0x0;
              local_378 = (undefined1  [16])0x0;
              local_368 = (undefined1  [16])0x0;
              local_358 = SUB1613((undefined1  [16])0x0,0);
              uStack_34b = 0;
              uStack_348._0_4_ = 0;
              uStack_348._4_1_ = false;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)local_3b8,
                         -this->_currentSettings->_realParamValues[6]);
              local_4d0._0_4_ = cpp_dec_float_finite;
              local_4d0._4_4_ = 0x1c;
              local_548._0_8_ = (type)0x0;
              local_548._8_8_ = (type)0x0;
              local_538 = (undefined1  [16])0x0;
              local_528.double_first = 0;
              local_518 = (undefined1  [16])0x0;
              local_508 = (undefined1  [16])0x0;
              local_4f8 = (undefined1  [16])0x0;
              local_4e8 = SUB1613((undefined1  [16])0x0,0);
              uStack_4db = 0;
              uStack_4d8._0_4_ = 0;
              uStack_4d8._4_1_ = false;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)local_548,
                         this->_currentSettings->_realParamValues[6]);
              (*(pSVar3->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._vptr_ClassArray[0x30])
                        (pSVar3,iVar20,local_3b8,(cpp_dec_float<200u,int,void> *)local_548,0);
              local_558._8_8_ = local_558._8_8_ & 0xffffffff;
              bVar9 = true;
            }
            uVar14 = *(uint *)((long)&local_3d8.
                                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                      .m_elem[-1].idx + lVar15);
            pSVar12 = this->_rationalLP;
            auVar7._8_8_ = 0;
            auVar7._0_8_ = local_548._8_8_;
            local_548 = auVar7 << 0x40;
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
            ::rational_adaptor<long_long>
                      ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)local_3b8,(longlong *)local_548,(type *)0x0);
            (*(pSVar12->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
              ._vptr_ClassArray[0x43])
                      (pSVar12,(ulong)uVar14,lVar11,(cpp_dec_float<200U,_int,_void> *)local_3b8,0);
            if ((local_388[5] == '\0') && (local_388[6] == '\0')) {
              operator_delete((void *)local_398._8_8_,(ulong)(uint)local_398._0_4_ << 3);
            }
            if ((local_3a8._M_local_buf[5] == '\0') && (local_3a8._M_local_buf[6] == '\0')) {
              operator_delete((void *)local_3b8._8_8_,(ulong)(uint)local_3b8._0_4_ << 3);
            }
            pSVar3 = this->_realLP;
            local_340._0_4_ = cpp_dec_float_finite;
            local_340._4_4_ = 0x1c;
            local_3b8 = (undefined1  [16])0x0;
            local_3a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         )0x0;
            local_398 = (undefined1  [16])0x0;
            local_388 = (undefined1  [16])0x0;
            local_378 = (undefined1  [16])0x0;
            local_368 = (undefined1  [16])0x0;
            local_358 = SUB1613((undefined1  [16])0x0,0);
            uStack_34b = 0;
            uStack_348._0_4_ = 0;
            uStack_348._4_1_ = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)local_3b8,0.0);
            (*(pSVar3->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x43])
                      (pSVar3,(ulong)uVar14,lVar11,(cpp_dec_float<200U,_int,_void> *)local_3b8);
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
            ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                *)local_548,
                               (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                *)prVar17);
            local_3b8._0_8_ = (Item *)local_418;
            boost::multiprecision::
            number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
            ::
            do_divide<boost::multiprecision::detail::expression<boost::multiprecision::detail::terminal,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,void,void,void>>
                      ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                        *)local_548,
                       (expression<boost::multiprecision::detail::terminal,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void,_void>
                        *)local_3b8,(terminal *)&local_498.ld);
            (*(this->_rationalLP->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
              ._vptr_ClassArray[0x43])
                      (this->_rationalLP,(ulong)uVar14,iVar20,
                       (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                        *)local_548);
            pSVar3 = this->_realLP;
            local_340._0_4_ = cpp_dec_float_finite;
            local_340._4_4_ = 0x1c;
            local_3b8 = (undefined1  [16])0x0;
            local_3a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         )0x0;
            local_398 = (undefined1  [16])0x0;
            local_388 = (undefined1  [16])0x0;
            local_378 = (undefined1  [16])0x0;
            local_368 = (undefined1  [16])0x0;
            local_358 = SUB1613((undefined1  [16])0x0,0);
            uStack_34b = 0;
            uStack_348._0_4_ = 0;
            uStack_348._4_1_ = false;
            boost::multiprecision::detail::
            generic_convert_rational_to_float<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>
                      ((cpp_dec_float<200U,_int,_void> *)local_3b8,
                       (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)local_548);
            vec = (Item *)(ulong)uVar14;
            (*(pSVar3->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x43])(pSVar3,vec,iVar20);
            if ((local_518[5] == false) && (local_518[6] == false)) {
              vec = (Item *)((ulong)local_528.ld.capacity << 3);
              operator_delete(local_528.ld.data,(ulong)vec);
            }
            if ((local_538[5] == false) && (local_538[6] == false)) {
              vec = (Item *)((ulong)(uint)local_548._0_4_ << 3);
              operator_delete((void *)local_548._8_8_,(ulong)vec);
            }
          }
          lVar16 = lVar16 + -1;
          lVar15 = lVar15 + -0x50;
        } while (1 < lVar16);
      }
      lVar11 = lVar11 + 1;
      pSVar12 = this->_rationalLP;
      iVar20 = (pSVar12->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
               .set.thenum;
    } while (lVar11 < iVar20);
  }
  if (this->_hasBasis != false) {
    uVar14 = iVar20 - this->_beforeLiftCols;
    if (uVar14 != 0 && this->_beforeLiftCols <= iVar20) {
      uVar1 = (this->_basisStatusCols).thesize;
      vec = (Item *)(ulong)uVar1;
      DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
      ::insert(&this->_basisStatusCols,uVar1,uVar14);
      auVar5 = _DAT_00601040;
      pVVar4 = (this->_basisStatusCols).data;
      lVar11 = (ulong)uVar14 - 1;
      auVar18._8_4_ = (int)lVar11;
      auVar18._0_8_ = lVar11;
      auVar18._12_4_ = (int)((ulong)lVar11 >> 0x20);
      uVar13 = 0;
      auVar18 = auVar18 ^ _DAT_00601040;
      auVar21 = _DAT_00601020;
      auVar23 = _DAT_00601030;
      do {
        auVar25 = auVar23 ^ auVar5;
        iVar20 = auVar18._4_4_;
        if ((bool)(~(auVar25._4_4_ == iVar20 && auVar18._0_4_ < auVar25._0_4_ ||
                    iVar20 < auVar25._4_4_) & 1)) {
          pVVar4[(long)(int)uVar1 + uVar13] = BASIC;
        }
        if ((auVar25._12_4_ != auVar18._12_4_ || auVar25._8_4_ <= auVar18._8_4_) &&
            auVar25._12_4_ <= auVar18._12_4_) {
          pVVar4[(long)(int)uVar1 + uVar13 + 1] = BASIC;
        }
        auVar25 = auVar21 ^ auVar5;
        iVar10 = auVar25._4_4_;
        if (iVar10 <= iVar20 && (iVar10 != iVar20 || auVar25._0_4_ <= auVar18._0_4_)) {
          pVVar4[(long)(int)uVar1 + uVar13 + 2] = BASIC;
          pVVar4[(long)(int)uVar1 + uVar13 + 3] = BASIC;
        }
        uVar13 = uVar13 + 4;
        lVar11 = auVar23._8_8_;
        auVar23._0_8_ = auVar23._0_8_ + 4;
        auVar23._8_8_ = lVar11 + 4;
        lVar11 = auVar21._8_8_;
        auVar21._0_8_ = auVar21._0_8_ + 4;
        auVar21._8_8_ = lVar11 + 4;
      } while ((uVar14 + 3 & 0xfffffffc) != uVar13);
    }
    iVar20 = (this->_rationalLP->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
             .set.thenum;
    uVar14 = iVar20 - this->_beforeLiftRows;
    if (uVar14 != 0 && this->_beforeLiftRows <= iVar20) {
      uVar1 = (this->_basisStatusRows).thesize;
      vec = (Item *)(ulong)uVar1;
      DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
      ::insert(&this->_basisStatusRows,uVar1,uVar14);
      auVar5 = _DAT_00601040;
      pVVar4 = (this->_basisStatusRows).data;
      lVar11 = (ulong)uVar14 - 1;
      auVar19._8_4_ = (int)lVar11;
      auVar19._0_8_ = lVar11;
      auVar19._12_4_ = (int)((ulong)lVar11 >> 0x20);
      uVar13 = 0;
      auVar19 = auVar19 ^ _DAT_00601040;
      auVar22 = _DAT_00601020;
      auVar24 = _DAT_00601030;
      do {
        auVar25 = auVar24 ^ auVar5;
        iVar20 = auVar19._4_4_;
        if ((bool)(~(auVar25._4_4_ == iVar20 && auVar19._0_4_ < auVar25._0_4_ ||
                    iVar20 < auVar25._4_4_) & 1)) {
          pVVar4[(long)(int)uVar1 + uVar13] = FIXED;
        }
        if ((auVar25._12_4_ != auVar19._12_4_ || auVar25._8_4_ <= auVar19._8_4_) &&
            auVar25._12_4_ <= auVar19._12_4_) {
          pVVar4[(long)(int)uVar1 + uVar13 + 1] = FIXED;
        }
        auVar25 = auVar22 ^ auVar5;
        iVar10 = auVar25._4_4_;
        if (iVar10 <= iVar20 && (iVar10 != iVar20 || auVar25._0_4_ <= auVar19._0_4_)) {
          pVVar4[(long)(int)uVar1 + uVar13 + 2] = FIXED;
          pVVar4[(long)(int)uVar1 + uVar13 + 3] = FIXED;
        }
        uVar13 = uVar13 + 4;
        lVar11 = auVar24._8_8_;
        auVar24._0_8_ = auVar24._0_8_ + 4;
        auVar24._8_8_ = lVar11 + 4;
        lVar11 = auVar22._8_8_;
        auVar22._0_8_ = auVar22._0_8_ + 4;
        auVar22._8_8_ = lVar11 + 4;
      } while ((uVar14 + 3 & 0xfffffffc) != uVar13);
    }
    if ((this->_rationalLUSolver).super_CLUFactorRational.stat != UNLOADED) {
      SLUFactorRational::init(&this->_rationalLUSolver,(EVP_PKEY_CTX *)vec);
    }
  }
  (*this->_statistics->transformTime->_vptr_Timer[4])();
  if (((this->_beforeLiftCols <
        (this->_rationalLP->
        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        .set.thenum) ||
      (this->_beforeLiftRows <
       (this->_rationalLP->
       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
       ).
       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
       .set.thenum)) && (VVar2 = (this->spxout).m_verbosity, 2 < (int)VVar2)) {
    (this->spxout).m_verbosity = INFO1;
    std::__ostream_insert<char,std::char_traits<char>>((this->spxout).m_streams[3],"Added ",6);
    std::ostream::operator<<
              ((ostream *)(this->spxout).m_streams[(this->spxout).m_verbosity],
               (this->_rationalLP->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
               .set.thenum - this->_beforeLiftCols);
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->spxout).m_streams[(this->spxout).m_verbosity]," columns and ",0xd);
    std::ostream::operator<<
              ((ostream *)(this->spxout).m_streams[(this->spxout).m_verbosity],
               (this->_rationalLP->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
               .set.thenum - this->_beforeLiftRows);
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->spxout).m_streams[(this->spxout).m_verbosity],
               " rows to reduce large matrix coefficients\n.",0x2b);
    (this->spxout).m_verbosity = VVar2;
  }
  if ((local_3e4._1_1_ == '\0') && (local_3e2 == '\0')) {
    operator_delete(local_3f0,(local_3f8 & 0xffffffff) << 3);
  }
  if ((local_410.memused._1_1_ == '\0') && (local_410.memused._2_1_ == '\0')) {
    operator_delete(local_410.m_elem,((ulong)local_418 & 0xffffffff) << 3);
  }
  if ((local_1e4._1_1_ == '\0') && (local_1e2 == '\0')) {
    operator_delete(local_1f0,(local_1f8 & 0xffffffff) << 3);
  }
  if ((local_204._1_1_ == '\0') && (local_202 == '\0')) {
    operator_delete((void *)local_218._8_8_,(local_218._0_8_ & 0xffffffff) << 3);
  }
  lVar11 = 0x50;
  do {
    if (((&local_158[0].val.m_backend.m_value.den.m_backend.
           super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
           .m_internal)[lVar11] == false) &&
       ((&local_158[0].val.m_backend.m_value.den.m_backend.
          super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          .m_alias)[lVar11] == false)) {
      operator_delete(*(void **)((long)&local_158[0].val.m_backend.m_value.den.m_backend.
                                        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                        .m_data + lVar11 + 8),
                      (ulong)*(uint *)((long)&local_158[0].val.m_backend.m_value.den.m_backend.
                                              super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                              .m_data + lVar11) << 3);
    }
    if (((&local_158[0].val.m_backend.m_value.num.m_backend.
           super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
           .m_internal)[lVar11] == false) &&
       ((&local_158[0].val.m_backend.m_value.num.m_backend.
          super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          .m_alias)[lVar11] == false)) {
      operator_delete(*(void **)((long)&local_158[0].val.m_backend.m_value.num.m_backend.
                                        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                        .m_data + lVar11 + 8),
                      (ulong)*(uint *)((long)&local_158[0].val.m_backend.m_value.num.m_backend.
                                              super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                              .m_data + lVar11) << 3);
    }
    lVar11 = lVar11 + -0x50;
  } while (lVar11 != -0x50);
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::~DSVectorBase(&local_3d8);
  return;
}

Assistant:

void SoPlexBase<R>::_lift()
{
   SPxOut::debug(this, "Reducing matrix coefficients by lifting.\n");

   // start timing
   _statistics->transformTime->start();

   SPX_DEBUG(_realLP->writeFileLPBase("beforeLift.lp", 0, 0, 0));

   // remember unlifted state
   _beforeLiftCols = numColsRational();
   _beforeLiftRows = numRowsRational();

   // allocate vector memory
   DSVectorRational colVector;
   SVectorRational::Element liftingRowMem[2];
   SVectorRational liftingRowVector(2, liftingRowMem);

   // search each column for large nonzeros entries
   // @todo: rethink about the static_cast TODO
   const Rational maxValue = static_cast<Rational>(realParam(SoPlexBase<R>::LIFTMAXVAL));

   for(int i = 0; i < numColsRational(); i++)
   {
      SPxOut::debug(this, "in lifting: examining column {}\n", i);

      // get column vector
      colVector = colVectorRational(i);

      bool addedLiftingRow = false;
      int liftingColumnIndex = -1;

      // go through nonzero entries of the column
      for(int k = colVector.size() - 1; k >= 0; k--)
      {
         const Rational& value = colVector.value(k);

         if(spxAbs(value) > maxValue)
         {
            SPxOut::debug(this, "   --> nonzero {} has value {} in row {}\n", k, value.str(),
                          colVector.index(k));

            // add new column equal to maxValue times original column
            if(!addedLiftingRow)
            {
               SPxOut::debug(this, "            --> adding lifting row\n");

               assert(liftingRowVector.size() == 0);

               liftingColumnIndex = numColsRational();
               liftingRowVector.add(i, maxValue);
               liftingRowVector.add(liftingColumnIndex, -1);

               _rationalLP->addRow(LPRowRational(0, liftingRowVector, 0));
               _realLP->addRow(LPRowBase<R>(0.0, DSVectorBase<R>(liftingRowVector), 0.0));

               assert(liftingColumnIndex == numColsRational() - 1);
               assert(liftingColumnIndex == numCols() - 1);

               _rationalLP->changeBounds(liftingColumnIndex, _rationalNegInfty, _rationalPosInfty);
               _realLP->changeBounds(liftingColumnIndex, -realParam(SoPlexBase<R>::INFTY),
                                     realParam(SoPlexBase<R>::INFTY));

               liftingRowVector.clear();
               addedLiftingRow = true;
            }

            // get row index
            int rowIndex = colVector.index(k);
            assert(rowIndex >= 0);
            assert(rowIndex < _beforeLiftRows);
            assert(liftingColumnIndex == numColsRational() - 1);

            SPxOut::debug(this, "            --> changing matrix\n");

            // remove nonzero from original column
            _rationalLP->changeElement(rowIndex, i, 0);
            _realLP->changeElement(rowIndex, i, 0.0);

            // add nonzero divided by maxValue to new column
            Rational newValue(value);
            newValue /= maxValue;
            _rationalLP->changeElement(rowIndex, liftingColumnIndex, newValue);
            _realLP->changeElement(rowIndex, liftingColumnIndex, R(newValue));
         }
      }
   }

   // search each column for small nonzeros entries
   const Rational minValue = Rational(realParam(SoPlexBase<R>::LIFTMINVAL));

   for(int i = 0; i < numColsRational(); i++)
   {
      SPxOut::debug(this, "in lifting: examining column {}\n", i);

      // get column vector
      colVector = colVectorRational(i);

      bool addedLiftingRow = false;
      int liftingColumnIndex = -1;

      // go through nonzero entries of the column
      for(int k = colVector.size() - 1; k >= 0; k--)
      {
         const Rational& value = colVector.value(k);

         if(spxAbs(value) < minValue)
         {
            SPxOut::debug(this, "   --> nonzero {} has value {} in row {}\n", k, value.str(),
                          colVector.index(k));

            // add new column equal to maxValue times original column
            if(!addedLiftingRow)
            {
               SPxOut::debug(this, "            --> adding lifting row\n");

               assert(liftingRowVector.size() == 0);

               liftingColumnIndex = numColsRational();
               liftingRowVector.add(i, minValue);
               liftingRowVector.add(liftingColumnIndex, -1);

               _rationalLP->addRow(LPRowRational(0, liftingRowVector, 0));
               _realLP->addRow(LPRowBase<R>(0.0, DSVectorBase<R>(liftingRowVector), 0.0));

               assert(liftingColumnIndex == numColsRational() - 1);
               assert(liftingColumnIndex == numCols() - 1);

               _rationalLP->changeBounds(liftingColumnIndex, _rationalNegInfty, _rationalPosInfty);
               _realLP->changeBounds(liftingColumnIndex, -realParam(SoPlexBase<R>::INFTY),
                                     realParam(SoPlexBase<R>::INFTY));

               liftingRowVector.clear();
               addedLiftingRow = true;
            }

            // get row index
            int rowIndex = colVector.index(k);
            assert(rowIndex >= 0);
            assert(rowIndex < _beforeLiftRows);
            assert(liftingColumnIndex == numColsRational() - 1);

            SPxOut::debug(this, "            --> changing matrix\n");

            // remove nonzero from original column
            _rationalLP->changeElement(rowIndex, i, 0);
            _realLP->changeElement(rowIndex, i, 0.0);

            // add nonzero divided by maxValue to new column
            Rational newValue(value);
            newValue /= minValue;
            _rationalLP->changeElement(rowIndex, liftingColumnIndex, newValue);
            _realLP->changeElement(rowIndex, liftingColumnIndex, R(newValue));
         }
      }
   }

   // adjust basis
   if(_hasBasis)
   {
      assert(numColsRational() >= _beforeLiftCols);
      assert(numRowsRational() >= _beforeLiftRows);

      _basisStatusCols.append(numColsRational() - _beforeLiftCols, SPxSolverBase<R>::BASIC);
      _basisStatusRows.append(numRowsRational() - _beforeLiftRows, SPxSolverBase<R>::FIXED);
      _rationalLUSolver.clear();
   }

   SPX_DEBUG(_realLP->writeFileLPBase("afterLift.lp", 0, 0, 0));

   // stop timing
   _statistics->transformTime->stop();

   if(numColsRational() > _beforeLiftCols || numRowsRational() > _beforeLiftRows)
   {
      SPX_MSG_INFO1(spxout, spxout << "Added " << numColsRational() - _beforeLiftCols << " columns and "
                    << numRowsRational() - _beforeLiftRows << " rows to reduce large matrix coefficients\n.");
   }
}